

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O1

Vec_Ptr_t * Hop_ManDfsNode(Hop_Man_t *p,Hop_Obj_t *pNode)

{
  uint *puVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  long lVar3;
  
  if (((ulong)pNode & 1) == 0) {
    vNodes = (Vec_Ptr_t *)malloc(0x10);
    vNodes->nCap = 0x10;
    vNodes->nSize = 0;
    ppvVar2 = (void **)malloc(0x80);
    vNodes->pArray = ppvVar2;
    Hop_ManDfs_rec(pNode,vNodes);
    if (0 < vNodes->nSize) {
      lVar3 = 0;
      do {
        puVar1 = (uint *)((long)vNodes->pArray[lVar3] + 0x20);
        *puVar1 = *puVar1 & 0xffffffef;
        lVar3 = lVar3 + 1;
      } while (lVar3 < vNodes->nSize);
    }
    return vNodes;
  }
  __assert_fail("!Hop_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopDfs.c"
                ,0x61,"Vec_Ptr_t *Hop_ManDfsNode(Hop_Man_t *, Hop_Obj_t *)");
}

Assistant:

Vec_Ptr_t * Hop_ManDfsNode( Hop_Man_t * p, Hop_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Hop_Obj_t * pObj;
    int i;
    assert( !Hop_IsComplement(pNode) );
    vNodes = Vec_PtrAlloc( 16 );
    Hop_ManDfs_rec( pNode, vNodes );
    Vec_PtrForEachEntry( Hop_Obj_t *, vNodes, pObj, i )
        Hop_ObjClearMarkA(pObj);
    return vNodes;
}